

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataSet.cpp
# Opt level: O0

shared_ptr<DataSet> DataSet::fromFile(string *file_name)

{
  byte bVar1;
  element_type *peVar2;
  reference pvVar3;
  runtime_error *this;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  string *in_RSI;
  element_type *in_RDI;
  shared_ptr<DataSet> sVar5;
  size_t f;
  vector<float,_std::allocator<float>_> vec;
  size_t v;
  size_t size;
  ifstream file;
  shared_ptr<DataSet> *ds;
  allocator_type *__a;
  vector<float,_std::allocator<float>_> *f_00;
  undefined7 in_stack_fffffffffffffd80;
  element_type *this_00;
  ulong local_268;
  undefined1 local_259 [25];
  ulong local_240;
  ulong local_238 [3];
  char local_220 [527];
  byte local_11;
  string *local_10;
  
  local_11 = 0;
  this_00 = in_RDI;
  local_10 = in_RSI;
  std::make_shared<DataSet>();
  std::ifstream::ifstream(local_220,local_10,_S_bin);
  bVar1 = std::ios::good();
  if ((bVar1 & 1) == 0) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"Could not load from file");
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  peVar2 = std::__shared_ptr_access<DataSet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<DataSet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      0x106b53);
  std::istream::read(local_220,(long)peVar2);
  std::istream::read(local_220,(long)local_238);
  std::__shared_ptr_access<DataSet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<DataSet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x106b8d);
  std::vector<FeatureVec,_std::allocator<FeatureVec>_>::reserve
            ((vector<FeatureVec,_std::allocator<FeatureVec>_> *)this_00,(size_type)in_RDI);
  for (local_240 = 0; local_240 < local_238[0]; local_240 = local_240 + 1) {
    peVar2 = std::__shared_ptr_access<DataSet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<DataSet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        0x106bc3);
    __a = (allocator_type *)peVar2->num_features;
    f_00 = (vector<float,_std::allocator<float>_> *)local_259;
    std::allocator<float>::allocator((allocator<float> *)0x106bda);
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)CONCAT17(bVar1,in_stack_fffffffffffffd80),
               (size_type)f_00,__a);
    std::allocator<float>::~allocator((allocator<float> *)0x106bfa);
    local_268 = 0;
    while( true ) {
      peVar2 = std::__shared_ptr_access<DataSet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<DataSet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          0x106c17);
      if (peVar2->num_features <= local_268) break;
      pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)(local_259 + 1),local_268);
      std::istream::read(local_220,(long)pvVar3);
      local_268 = local_268 + 1;
    }
    std::__shared_ptr_access<DataSet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<DataSet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x106cd6);
    addVector((DataSet *)CONCAT17(bVar1,in_stack_fffffffffffffd80),f_00);
    std::vector<float,_std::allocator<float>_>::~vector
              ((vector<float,_std::allocator<float>_> *)__a);
  }
  local_11 = 1;
  std::ifstream::~ifstream(local_220);
  _Var4._M_pi = extraout_RDX;
  if ((local_11 & 1) == 0) {
    std::shared_ptr<DataSet>::~shared_ptr((shared_ptr<DataSet> *)0x106d94);
    _Var4._M_pi = extraout_RDX_00;
  }
  sVar5.super___shared_ptr<DataSet,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var4._M_pi;
  sVar5.super___shared_ptr<DataSet,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this_00;
  return (shared_ptr<DataSet>)sVar5.super___shared_ptr<DataSet,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<DataSet> DataSet::fromFile(const std::string &file_name) {
  auto ds = std::make_shared<DataSet>();

  std::ifstream file(file_name, std::ios::binary);

  if (file.good()) {
    // Read num features
    file.read((char *) &ds->num_features, sizeof(size_t));
    size_t size;
    // Read number of vectors
    file.read((char *) &size, sizeof(size_t));
    ds->vectors.reserve(size);
    for (size_t v = 0; v < size; v++) {
      std::vector<float> vec(ds->num_features);
      for (size_t f = 0; f < ds->num_features; f++) {
        file.read((char *) &vec[f], sizeof(float));
      }
      ds->addVector(vec);
    }
    return ds;
  } else {
    throw std::runtime_error("Could not load from file");
  }

}